

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SCASerialization.h
# Opt level: O3

void __thiscall
Js::SerializationCloner<Js::StreamWriter>::WriteObjectProperties<Js::ObjectPropertyEnumerator>
          (SerializationCloner<Js::StreamWriter> *this,ObjectPropertyEnumerator *enumerator)

{
  bool bVar1;
  charcount_t len;
  char16 *str;
  Engine *this_00;
  uint local_30 [2];
  uint unused;
  
  bVar1 = ObjectPropertyEnumerator::MoveNext(enumerator);
  if (bVar1) {
    do {
      str = JavascriptString::GetString(enumerator->m_name);
      len = JavascriptString::GetLength(enumerator->m_name);
      Write(this,str,len);
      this_00 = ClonerBase<void_*,_unsigned_int,_Js::TypeId,_Js::SerializationCloner<Js::StreamWriter>_>
                ::GetEngine(&this->
                             super_ClonerBase<void_*,_unsigned_int,_Js::TypeId,_Js::SerializationCloner<Js::StreamWriter>_>
                           );
      SCAEngine<void_*,_unsigned_int,_Js::SerializationCloner<Js::StreamWriter>_>::Clone
                (this_00,enumerator->m_value,local_30);
      bVar1 = ObjectPropertyEnumerator::MoveNext(enumerator);
    } while (bVar1);
  }
  local_30[1] = 0xffffffff;
  StreamWriter::Write<unsigned_int>(this->m_writer,local_30 + 1);
  return;
}

Assistant:

void WriteObjectProperties(Enumerator* enumerator)
        {
            while (enumerator->MoveNext())
            {
                // Write property name
                Write(enumerator->GetNameString(), enumerator->GetNameLength());

                // Write property value
                this->GetEngine()->Clone(enumerator->GetValue());
            }

            // Write property terminator
            m_writer->Write(static_cast<uint32>(SCA_PROPERTY_TERMINATOR));
        }